

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O0

void CoreMLConverter::loadCaffeNetwork
               (string *srcPathWeights,NetParameter *caffeSpecWeights,string *srcPathProto,
               NetParameter *caffeSpecProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *meanImagePathProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
               *meanImageBlobProto)

{
  int *input;
  bool bVar1;
  CodedInputStream *pCVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  ulong uVar5;
  char *__file;
  reference __k;
  mapped_type *this;
  string local_ad0 [32];
  stringstream local_ab0 [8];
  stringstream msg_2;
  ostream local_aa0 [376];
  undefined1 local_928 [8];
  IstreamInputStream raw_input_mean_image;
  ifstream iarc_mean_image;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *imageProto;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  undefined1 local_689;
  string local_688 [32];
  stringstream local_668 [8];
  stringstream msg_1;
  ostream local_658 [376];
  undefined1 local_4e0 [8];
  FileInputStream fileInput;
  undefined1 local_480 [4];
  int fileDescriptor;
  undefined1 local_459;
  string local_458 [32];
  stringstream local_438 [8];
  stringstream msg;
  ostream local_428 [383];
  undefined1 local_2a9;
  CodedInputStream *pCStack_2a8;
  bool openSuccess;
  CodedInputStream *coded_input;
  undefined1 local_290 [8];
  IstreamInputStream raw_input;
  ifstream iarc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
  *meanImageBlobProto_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *meanImagePathProto_local;
  NetParameter *caffeSpecProto_local;
  string *srcPathProto_local;
  NetParameter *caffeSpecWeights_local;
  string *srcPathWeights_local;
  
  input = &raw_input.impl_.backup_bytes_;
  std::ifstream::ifstream(input,(string *)srcPathWeights,_S_bin);
  google::protobuf::io::IstreamInputStream::IstreamInputStream
            ((IstreamInputStream *)local_290,(istream *)input,-1);
  pCVar2 = (CodedInputStream *)operator_new(0x50);
  google::protobuf::io::CodedInputStream::CodedInputStream(pCVar2,(ZeroCopyInputStream *)local_290);
  pCStack_2a8 = pCVar2;
  google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar2,0x7fffffff,0x20000000);
  local_2a9 = google::protobuf::MessageLite::ParseFromCodedStream
                        ((MessageLite *)caffeSpecWeights,pCStack_2a8);
  if (!(bool)local_2a9) {
    std::__cxx11::stringstream::stringstream(local_438);
    std::operator<<(local_428,"Unable to load caffe network Weights file: ");
    poVar3 = std::operator<<(local_428,(string *)srcPathWeights);
    std::operator<<(poVar3,". ");
    local_459 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_458);
    local_459 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_480,(string *)srcPathWeights);
  upgradeCaffeNetworkIfNeeded((string *)local_480,caffeSpecWeights);
  std::__cxx11::string::~string((string *)local_480);
  pCVar2 = pCStack_2a8;
  if (pCStack_2a8 != (CodedInputStream *)0x0) {
    google::protobuf::io::CodedInputStream::~CodedInputStream(pCStack_2a8);
    operator_delete(pCVar2,0x50);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    fileInput.impl_._52_4_ = open(__file,0);
    google::protobuf::io::FileInputStream::FileInputStream
              ((FileInputStream *)local_4e0,fileInput.impl_._52_4_,-1);
    google::protobuf::io::FileInputStream::SetCloseOnDelete((FileInputStream *)local_4e0,true);
    local_2a9 = google::protobuf::TextFormat::Parse
                          ((ZeroCopyInputStream *)local_4e0,&caffeSpecProto->super_Message);
    if (!(bool)local_2a9) {
      std::__cxx11::stringstream::stringstream(local_668);
      std::operator<<(local_658,"Unable to load caffe network Prototxt file: ");
      std::operator<<(local_658,(string *)srcPathProto);
      local_689 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_688);
      local_689 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&__range1,(string *)srcPathProto);
    upgradeCaffeNetworkIfNeeded((string *)&__range1,caffeSpecProto);
    std::__cxx11::string::~string((string *)&__range1);
    google::protobuf::io::FileInputStream::~FileInputStream((FileInputStream *)local_4e0);
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(meanImagePathProto);
  imageProto = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(meanImagePathProto);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&imageProto);
    if (!bVar1) {
      google::protobuf::io::IstreamInputStream::~IstreamInputStream((IstreamInputStream *)local_290)
      ;
      std::ifstream::~ifstream(&raw_input.impl_.backup_bytes_);
      return;
    }
    __k = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*(&__end1);
    std::ifstream::ifstream(&raw_input_mean_image.impl_.backup_bytes_,(string *)&__k->second,_S_bin)
    ;
    google::protobuf::io::IstreamInputStream::IstreamInputStream
              ((IstreamInputStream *)local_928,(istream *)&raw_input_mean_image.impl_.backup_bytes_,
               -1);
    pCVar2 = (CodedInputStream *)operator_new(0x50);
    google::protobuf::io::CodedInputStream::CodedInputStream
              (pCVar2,(ZeroCopyInputStream *)local_928);
    pCStack_2a8 = pCVar2;
    google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar2,0x7fffffff,0x20000000);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
           ::operator[](meanImageBlobProto,&__k->first);
    local_2a9 = google::protobuf::MessageLite::ParseFromCodedStream((MessageLite *)this,pCStack_2a8)
    ;
    pCVar2 = pCStack_2a8;
    if (!(bool)local_2a9) break;
    if (pCStack_2a8 != (CodedInputStream *)0x0) {
      google::protobuf::io::CodedInputStream::~CodedInputStream(pCStack_2a8);
      operator_delete(pCVar2,0x50);
    }
    google::protobuf::io::IstreamInputStream::~IstreamInputStream((IstreamInputStream *)local_928);
    std::ifstream::~ifstream(&raw_input_mean_image.impl_.backup_bytes_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::stringstream(local_ab0);
  std::operator<<(local_aa0,"Unable to load caffe network mean image binary proto file: ");
  std::operator<<(local_aa0,(string *)&__k->second);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar4,local_ad0);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoreMLConverter::loadCaffeNetwork(const std::string& srcPathWeights,
                                      caffe::NetParameter& caffeSpecWeights,
                                      const std::string& srcPathProto,
                                      caffe::NetParameter& caffeSpecProto,
                                      const std::map<std::string, std::string>& meanImagePathProto,
                                      std::map<std::string, caffe::BlobProto>& meanImageBlobProto) {
    
    // Load the Caffemodel weights file
    std::ifstream iarc(srcPathWeights, std::ios::binary);
    google::protobuf::io::IstreamInputStream raw_input(&iarc);
    google::protobuf::io::CodedInputStream* coded_input = new google::protobuf::io::CodedInputStream(&raw_input);
    
    // Load in streams because these network files are going to be large and
    // protobuf default reader fails if messages are larger than 64MB.
    coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
    bool openSuccess = caffeSpecWeights.ParseFromCodedStream(coded_input);
    if (!openSuccess) {
        std::stringstream msg;
        msg << "Unable to load caffe network Weights file: ";
        msg << srcPathWeights << ". ";
        throw std::runtime_error(msg.str());
    }
    CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathWeights, caffeSpecWeights);
    delete coded_input;

    // Load the caffe prototxt file if applicable
    if (not srcPathProto.empty()) {
        int fileDescriptor = open(srcPathProto.c_str(), O_RDONLY);
        google::protobuf::io::FileInputStream fileInput(fileDescriptor);
        fileInput.SetCloseOnDelete( true );
        openSuccess = google::protobuf::TextFormat::Parse(&fileInput, &caffeSpecProto);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network Prototxt file: ";
            msg << srcPathProto;
            throw std::runtime_error(msg.str());
        }
        CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathProto, caffeSpecProto);
    }
    
    // Load the binary proto file if available
    for (const auto& imageProto : meanImagePathProto) {
        std::ifstream iarc_mean_image(imageProto.second, std::ios::binary);
        google::protobuf::io::IstreamInputStream raw_input_mean_image(&iarc_mean_image);
        coded_input = new google::protobuf::io::CodedInputStream(&raw_input_mean_image);
        coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
        openSuccess = meanImageBlobProto[imageProto.first].ParseFromCodedStream(coded_input);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network mean image binary proto file: ";
            msg << imageProto.second;
            throw std::runtime_error(msg.str());
        }
        delete coded_input;
    }
    
}